

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.cc
# Opt level: O0

TemplateString *
ctemplate::TemplateDictionary::CreateSubdictName_abi_cxx11_
          (TemplateString *dict_name,TemplateString *sub_name,size_t index,char *suffix)

{
  undefined1 local_148 [48];
  undefined1 local_118 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98 [32];
  char local_78 [8];
  char index_str [64];
  char *suffix_local;
  size_t index_local;
  TemplateString *sub_name_local;
  TemplateString *dict_name_local;
  
  snprintf(local_78,0x40,"%lu",suffix);
  PrintableTemplateString_abi_cxx11_((TemplateDictionary *)local_118,sub_name);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_118 + 0x20),(char *)local_118);
  PrintableTemplateString_abi_cxx11_((TemplateDictionary *)local_148,(TemplateString *)index);
  std::operator+(local_d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (local_118 + 0x20));
  std::operator+(local_b8,(char *)local_d8);
  std::operator+(local_98,(char *)local_b8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)dict_name,
                 (char *)local_98);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::string::~string((string *)local_d8);
  std::__cxx11::string::~string((string *)local_148);
  std::__cxx11::string::~string((string *)(local_118 + 0x20));
  std::__cxx11::string::~string((string *)local_118);
  return dict_name;
}

Assistant:

string TemplateDictionary::CreateSubdictName(
    const TemplateString& dict_name, const TemplateString& sub_name,
    size_t index, const char* suffix) {
  char index_str[64];
  snprintf(index_str, sizeof(index_str), "%" PRIuS, index);
  return (PrintableTemplateString(dict_name) + "/" +
          PrintableTemplateString(sub_name) + "#" + index_str + suffix);
}